

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::RawMessageSet::ByteSizeLong(RawMessageSet *this)

{
  int iVar1;
  Rep *pRVar2;
  size_t sVar3;
  anon_union_32_1_493b367e_for_RawMessageSet_3 *this_00;
  size_t sVar4;
  anon_union_32_1_493b367e_for_RawMessageSet_3 *paVar5;
  
  iVar1 = *(int *)((long)&this->field_0 + 8);
  this_00 = &this->field_0;
  paVar5 = this_00;
  if ((undefined1  [32])((undefined1  [32])this->field_0 & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    pRVar2 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       ((RepeatedPtrFieldBase *)&this_00->_impl_);
    paVar5 = (anon_union_32_1_493b367e_for_RawMessageSet_3 *)pRVar2->elements;
  }
  if ((undefined1  [32])((undefined1  [32])*this_00 & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    pRVar2 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       ((RepeatedPtrFieldBase *)&this_00->_impl_);
    this_00 = (anon_union_32_1_493b367e_for_RawMessageSet_3 *)pRVar2->elements;
  }
  sVar4 = (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 8);
  for (; paVar5 != (anon_union_32_1_493b367e_for_RawMessageSet_3 *)((long)this_00 + (long)iVar1 * 8)
      ; paVar5 = (anon_union_32_1_493b367e_for_RawMessageSet_3 *)((long)paVar5 + 8)) {
    sVar3 = RawMessageSet_Item::ByteSizeLong
                      ((RawMessageSet_Item *)
                       (paVar5->_impl_).item_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_);
    sVar4 = sVar4 + sVar3;
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t RawMessageSet::ByteSizeLong() const {
  const RawMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.RawMessageSet)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated group Item = 1 { ... };
    {
      total_size += 2UL * this_._internal_item_size();
      for (const auto& msg : this_._internal_item()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}